

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

Header * SQLite::Database::getHeaderInfo(Header *__return_storage_ptr__,string *aFilename)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  Exception *pEVar7;
  long in_FS_OFFSET;
  char local_328 [8];
  ifstream fileBuffer;
  char *pHeaderStr;
  char *pBuf;
  string *aFilename_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  uchar buf [100];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (aFilename);
  if (bVar1) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar7,"Filename parameter is empty");
    if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
      __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (aFilename);
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_328,pcVar5,_Var3);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      std::operator+(&local_d8,"Error opening file ",aFilename);
      Exception::Exception(pEVar7,&local_d8);
      if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
        __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      std::istream::seekg((long)local_328,_S_beg);
      std::istream::read(local_328,(long)&local_78);
      std::ifstream::close();
      lVar6 = std::istream::gcount();
      if (lVar6 < 100) {
        pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
        std::operator+(&local_b8,"File ",aFilename);
        std::operator+(&local_98,&local_b8," is too short");
        Exception::Exception(pEVar7,&local_98);
        if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
          __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
        }
      }
      else {
        std::ifstream::~ifstream(local_328);
        *(undefined8 *)__return_storage_ptr__->headerStr = local_78;
        *(undefined8 *)(__return_storage_ptr__->headerStr + 8) = buf._0_8_;
        __return_storage_ptr__->headerStr[0xf] = '\0';
        iVar4 = strncmp((char *)__return_storage_ptr__,"SQLite format 3",0xf);
        if (iVar4 == 0) {
          __return_storage_ptr__->pageSizeBytes =
               (uint)(ushort)(buf._8_2_ << 8 | (ushort)buf._8_2_ >> 8);
          __return_storage_ptr__->fileFormatWriteVersion = buf[10];
          __return_storage_ptr__->fileFormatReadVersion = buf[0xb];
          __return_storage_ptr__->reservedSpaceBytes = buf[0xc];
          __return_storage_ptr__->maxEmbeddedPayloadFrac = buf[0xd];
          __return_storage_ptr__->minEmbeddedPayloadFrac = buf[0xe];
          __return_storage_ptr__->leafPayloadFrac = buf[0xf];
          __return_storage_ptr__->fileChangeCounter =
               (long)(int)((uint)buf._16_4_ >> 0x18 | (buf._16_4_ & 0xff0000) >> 8 |
                           (buf._16_4_ & 0xff00) << 8 | buf._16_4_ << 0x18);
          __return_storage_ptr__->databaseSizePages =
               (long)(int)((uint)buf._20_4_ >> 0x18 | (buf._20_4_ & 0xff0000) >> 8 |
                           (buf._20_4_ & 0xff00) << 8 | buf._20_4_ << 0x18);
          __return_storage_ptr__->firstFreelistTrunkPage =
               (long)(int)((uint)buf._24_4_ >> 0x18 | (buf._24_4_ & 0xff0000) >> 8 |
                           (buf._24_4_ & 0xff00) << 8 | buf._24_4_ << 0x18);
          __return_storage_ptr__->totalFreelistPages =
               (long)(int)((uint)buf._28_4_ >> 0x18 | (buf._28_4_ & 0xff0000) >> 8 |
                           (buf._28_4_ & 0xff00) << 8 | buf._28_4_ << 0x18);
          __return_storage_ptr__->schemaCookie =
               (long)(int)((uint)buf._32_4_ >> 0x18 | (buf._32_4_ & 0xff0000) >> 8 |
                           (buf._32_4_ & 0xff00) << 8 | buf._32_4_ << 0x18);
          __return_storage_ptr__->schemaFormatNumber =
               (long)(int)((uint)buf._36_4_ >> 0x18 | (buf._36_4_ & 0xff0000) >> 8 |
                           (buf._36_4_ & 0xff00) << 8 | buf._36_4_ << 0x18);
          __return_storage_ptr__->defaultPageCacheSizeBytes =
               (long)(int)((uint)buf._40_4_ >> 0x18 | (buf._40_4_ & 0xff0000) >> 8 |
                           (buf._40_4_ & 0xff00) << 8 | buf._40_4_ << 0x18);
          __return_storage_ptr__->largestBTreePageNumber =
               (long)(int)((uint)buf._44_4_ >> 0x18 | (buf._44_4_ & 0xff0000) >> 8 |
                           (buf._44_4_ & 0xff00) << 8 | buf._44_4_ << 0x18);
          __return_storage_ptr__->databaseTextEncoding =
               (long)(int)((uint)buf._48_4_ >> 0x18 | (buf._48_4_ & 0xff0000) >> 8 |
                           (buf._48_4_ & 0xff00) << 8 | buf._48_4_ << 0x18);
          __return_storage_ptr__->userVersion =
               (long)(int)((uint)buf._52_4_ >> 0x18 | (buf._52_4_ & 0xff0000) >> 8 |
                           (buf._52_4_ & 0xff00) << 8 | buf._52_4_ << 0x18);
          __return_storage_ptr__->incrementalVaccumMode =
               (long)(int)((uint)buf._56_4_ >> 0x18 | (buf._56_4_ & 0xff0000) >> 8 |
                           (buf._56_4_ & 0xff00) << 8 | buf._56_4_ << 0x18);
          __return_storage_ptr__->applicationId =
               (long)(int)((uint)buf._60_4_ >> 0x18 | (buf._60_4_ & 0xff0000) >> 8 |
                           (buf._60_4_ & 0xff00) << 8 | buf._60_4_ << 0x18);
          __return_storage_ptr__->versionValidFor =
               (long)(int)((uint)buf._84_4_ >> 0x18 | (buf._84_4_ & 0xff0000) >> 8 |
                           (buf._84_4_ & 0xff00) << 8 | buf._84_4_ << 0x18);
          __return_storage_ptr__->sqliteVersion =
               (long)(int)((uint)buf._88_4_ >> 0x18 | (buf._88_4_ & 0xff0000) >> 8 |
                           (buf._88_4_ & 0xff00) << 8 | buf._88_4_ << 0x18);
          if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
            return __return_storage_ptr__;
          }
        }
        else {
          pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &aFilename_local,"Invalid or encrypted SQLite header in file ",aFilename);
          Exception::Exception(pEVar7,(string *)&aFilename_local);
          if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Header Database::getHeaderInfo(const std::string& aFilename)
{
    Header h;
    unsigned char buf[100];
    char* pBuf = reinterpret_cast<char*>(&buf[0]);
    char* pHeaderStr = reinterpret_cast<char*>(&h.headerStr[0]);

    if (aFilename.empty())
    {
        throw SQLite::Exception("Filename parameter is empty");
    }

    {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        if (fileBuffer.is_open())
        {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.read(pBuf, 100);
            fileBuffer.close();
            if (fileBuffer.gcount() < 100)
            {
                throw SQLite::Exception("File " + aFilename + " is too short");
            }
        }
        else
        {
            throw SQLite::Exception("Error opening file " + aFilename);
        }
    }

    // If the "magic string" can't be found then header is invalid, corrupt or unreadable
    memcpy(pHeaderStr, pBuf, 16);
    pHeaderStr[15] = '\0';
    if (strncmp(pHeaderStr, "SQLite format 3", 15) != 0)
    {
        throw SQLite::Exception("Invalid or encrypted SQLite header in file " + aFilename);
    }

    h.pageSizeBytes = (buf[16] << 8) | buf[17];
    h.fileFormatWriteVersion = buf[18];
    h.fileFormatReadVersion = buf[19];
    h.reservedSpaceBytes = buf[20];
    h.maxEmbeddedPayloadFrac = buf[21];
    h.minEmbeddedPayloadFrac = buf[22];
    h.leafPayloadFrac = buf[23];

    h.fileChangeCounter =
        (buf[24] << 24) |
        (buf[25] << 16) |
        (buf[26] << 8)  |
        (buf[27] << 0);

    h.databaseSizePages =
        (buf[28] << 24) |
        (buf[29] << 16) |
        (buf[30] << 8)  |
        (buf[31] << 0);

    h.firstFreelistTrunkPage =
        (buf[32] << 24) |
        (buf[33] << 16) |
        (buf[34] << 8)  |
        (buf[35] << 0);

    h.totalFreelistPages =
        (buf[36] << 24) |
        (buf[37] << 16) |
        (buf[38] << 8)  |
        (buf[39] << 0);

    h.schemaCookie =
        (buf[40] << 24) |
        (buf[41] << 16) |
        (buf[42] << 8)  |
        (buf[43] << 0);

    h.schemaFormatNumber =
        (buf[44] << 24) |
        (buf[45] << 16) |
        (buf[46] << 8)  |
        (buf[47] << 0);

    h.defaultPageCacheSizeBytes =
        (buf[48] << 24) |
        (buf[49] << 16) |
        (buf[50] << 8)  |
        (buf[51] << 0);

    h.largestBTreePageNumber =
        (buf[52] << 24) |
        (buf[53] << 16) |
        (buf[54] << 8)  |
        (buf[55] << 0);

    h.databaseTextEncoding =
        (buf[56] << 24) |
        (buf[57] << 16) |
        (buf[58] << 8)  |
        (buf[59] << 0);

    h.userVersion =
        (buf[60] << 24) |
        (buf[61] << 16) |
        (buf[62] << 8)  |
        (buf[63] << 0);

    h.incrementalVaccumMode =
        (buf[64] << 24) |
        (buf[65] << 16) |
        (buf[66] << 8)  |
        (buf[67] << 0);

    h.applicationId =
        (buf[68] << 24) |
        (buf[69] << 16) |
        (buf[70] << 8)  |
        (buf[71] << 0);

    h.versionValidFor =
        (buf[92] << 24) |
        (buf[93] << 16) |
        (buf[94] << 8)  |
        (buf[95] << 0);

    h.sqliteVersion =
        (buf[96] << 24) |
        (buf[97] << 16) |
        (buf[98] << 8)  |
        (buf[99] << 0);

    return h;
}